

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::JsonUnitTestResultPrinter::PrintJsonTestCase
               (ostream *stream,TestCase *test_case)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  string *element_name;
  TestInfo *this;
  TestCase *in_RSI;
  string *in_RDI;
  int i;
  bool comma;
  TestInfo *in_stack_00000270;
  char *in_stack_00000278;
  ostream *in_stack_00000280;
  string kIndent;
  string kTestsuite;
  undefined8 in_stack_fffffffffffffcd8;
  TestCase *in_stack_fffffffffffffce0;
  string *in_stack_fffffffffffffcf8;
  int width;
  undefined4 in_stack_fffffffffffffdac;
  undefined1 uVar5;
  string *in_stack_fffffffffffffdb0;
  string *indent;
  string *in_stack_fffffffffffffdb8;
  TestResult *result;
  string *psVar6;
  string *stream_00;
  string local_208 [32];
  int local_1e8;
  byte local_1e1;
  string local_1e0 [32];
  string local_1c0 [39];
  allocator local_199;
  string local_198 [16];
  TimeInMillis in_stack_fffffffffffffe78;
  allocator local_171;
  string local_170 [39];
  allocator local_149;
  string local_148 [39];
  allocator local_121;
  string local_120 [39];
  undefined1 local_f9 [40];
  undefined1 local_d1 [40];
  allocator local_a9;
  string local_a8 [32];
  string local_88 [32];
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  TestCase *local_10;
  string *local_8;
  
  uVar5 = (undefined1)((uint)in_stack_fffffffffffffdac >> 0x18);
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"testsuite",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  Indent_abi_cxx11_((int)((ulong)in_stack_fffffffffffffcf8 >> 0x20));
  psVar6 = local_8;
  Indent_abi_cxx11_((int)((ulong)in_stack_fffffffffffffcf8 >> 0x20));
  poVar4 = std::operator<<((ostream *)psVar6,local_88);
  std::operator<<(poVar4,"{\n");
  std::__cxx11::string::~string(local_88);
  stream_00 = local_8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"name",&local_a9);
  element_name = (string *)TestCase::name((TestCase *)0x1730f1);
  psVar6 = (string *)local_d1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_d1 + 1),(char *)element_name,(allocator *)psVar6);
  OutputJsonKey((ostream *)stream_00,element_name,psVar6,in_stack_fffffffffffffdb8,
                in_stack_fffffffffffffdb0,(bool)uVar5);
  std::__cxx11::string::~string((string *)(local_d1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_d1);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  result = (TestResult *)local_f9;
  indent = local_8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_f9 + 1),"tests",(allocator *)result);
  iVar2 = TestCase::reportable_test_count((TestCase *)0x1731e8);
  uVar5 = (undefined1)((uint)iVar2 >> 0x18);
  OutputJsonKey((ostream *)stream_00,element_name,psVar6,(int)((ulong)result >> 0x20),indent,
                (bool)uVar5);
  std::__cxx11::string::~string((string *)(local_f9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_f9);
  if ((FLAGS_gtest_list_tests & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_120,"failures",&local_121);
    TestCase::failed_test_count((TestCase *)0x17329f);
    OutputJsonKey((ostream *)stream_00,element_name,psVar6,(int)((ulong)result >> 0x20),indent,
                  (bool)uVar5);
    std::__cxx11::string::~string(local_120);
    std::allocator<char>::~allocator((allocator<char> *)&local_121);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_148,"disabled",&local_149);
    TestCase::reportable_disabled_test_count((TestCase *)0x173346);
    OutputJsonKey((ostream *)stream_00,element_name,psVar6,(int)((ulong)result >> 0x20),indent,
                  (bool)uVar5);
    std::__cxx11::string::~string(local_148);
    std::allocator<char>::~allocator((allocator<char> *)&local_149);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_170,"errors",&local_171);
    OutputJsonKey((ostream *)stream_00,element_name,psVar6,(int)((ulong)result >> 0x20),indent,
                  (bool)uVar5);
    std::__cxx11::string::~string(local_170);
    std::allocator<char>::~allocator((allocator<char> *)&local_171);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_198,"time",&local_199);
    TestCase::elapsed_time(local_10);
    FormatTimeInMillisAsDuration_abi_cxx11_(in_stack_fffffffffffffe78);
    OutputJsonKey((ostream *)stream_00,element_name,psVar6,(string *)result,indent,(bool)uVar5);
    std::__cxx11::string::~string(local_1c0);
    std::__cxx11::string::~string(local_198);
    std::allocator<char>::~allocator((allocator<char> *)&local_199);
    psVar6 = local_8;
    TestCase::ad_hoc_test_result(local_10);
    TestPropertiesAsJson(result,indent);
    poVar4 = std::operator<<((ostream *)psVar6,local_1e0);
    std::operator<<(poVar4,",\n");
    std::__cxx11::string::~string(local_1e0);
  }
  poVar4 = std::operator<<((ostream *)local_8,local_68);
  poVar4 = std::operator<<(poVar4,"\"");
  poVar4 = std::operator<<(poVar4,local_30);
  std::operator<<(poVar4,"\": [\n");
  local_1e1 = 0;
  local_1e8 = 0;
  while( true ) {
    iVar2 = local_1e8;
    iVar3 = TestCase::total_test_count((TestCase *)0x1738c2);
    width = (int)((ulong)in_stack_fffffffffffffcf8 >> 0x20);
    if (iVar3 <= iVar2) break;
    this = TestCase::GetTestInfo
                     (in_stack_fffffffffffffce0,(int)((ulong)in_stack_fffffffffffffcd8 >> 0x20));
    bVar1 = TestInfo::is_reportable(this);
    if (bVar1) {
      if ((local_1e1 & 1) == 0) {
        local_1e1 = 1;
      }
      else {
        std::operator<<((ostream *)local_8,",\n");
      }
      in_stack_fffffffffffffcf8 = local_8;
      TestCase::name((TestCase *)0x173949);
      TestCase::GetTestInfo
                (in_stack_fffffffffffffce0,(int)((ulong)in_stack_fffffffffffffcd8 >> 0x20));
      OutputJsonTestInfo(in_stack_00000280,in_stack_00000278,in_stack_00000270);
    }
    local_1e8 = local_1e8 + 1;
  }
  poVar4 = std::operator<<((ostream *)local_8,"\n");
  poVar4 = std::operator<<(poVar4,local_68);
  poVar4 = std::operator<<(poVar4,"]\n");
  Indent_abi_cxx11_(width);
  poVar4 = std::operator<<(poVar4,local_208);
  std::operator<<(poVar4,"}");
  std::__cxx11::string::~string(local_208);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void JsonUnitTestResultPrinter::PrintJsonTestCase(std::ostream* stream,
                                                  const TestCase& test_case) {
  const std::string kTestsuite = "testsuite";
  const std::string kIndent = Indent(6);

  *stream << Indent(4) << "{\n";
  OutputJsonKey(stream, kTestsuite, "name", test_case.name(), kIndent);
  OutputJsonKey(stream, kTestsuite, "tests", test_case.reportable_test_count(),
                kIndent);
  if (!GTEST_FLAG(list_tests)) {
    OutputJsonKey(stream, kTestsuite, "failures", test_case.failed_test_count(),
                  kIndent);
    OutputJsonKey(stream, kTestsuite, "disabled",
                  test_case.reportable_disabled_test_count(), kIndent);
    OutputJsonKey(stream, kTestsuite, "errors", 0, kIndent);
    OutputJsonKey(stream, kTestsuite, "time",
                  FormatTimeInMillisAsDuration(test_case.elapsed_time()),
                  kIndent, false);
    *stream << TestPropertiesAsJson(test_case.ad_hoc_test_result(), kIndent)
            << ",\n";
  }

  *stream << kIndent << "\"" << kTestsuite << "\": [\n";

  bool comma = false;
  for (int i = 0; i < test_case.total_test_count(); ++i) {
    if (test_case.GetTestInfo(i)->is_reportable()) {
      if (comma) {
        *stream << ",\n";
      } else {
        comma = true;
      }
      OutputJsonTestInfo(stream, test_case.name(), *test_case.GetTestInfo(i));
    }
  }
  *stream << "\n" << kIndent << "]\n" << Indent(4) << "}";
}